

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

size_t __thiscall
CCharmapToUniSB_basic::read_file
          (CCharmapToUniSB_basic *this,CVmDataSource *fp,char *buf,size_t bufl)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  size_t local_30;
  char *local_28;
  
  uVar3 = bufl / 3;
  if (0x1ff < uVar3) {
    uVar3 = 0x200;
  }
  local_30 = bufl;
  local_28 = buf;
  iVar1 = (*fp->_vptr_CVmDataSource[3])(fp,this->inbuf_,uVar3);
  sVar2 = (**(code **)(*(long *)this + 0x20))(this,&local_28,&local_30,this->inbuf_,(long)iVar1);
  return sVar2;
}

Assistant:

size_t CCharmapToUniSB_basic::read_file(CVmDataSource *fp,
                                        char *buf, size_t bufl)
{
    size_t inlen;

    /* 
     *   Compute how much to read from the file.  The input file is
     *   composed of single-byte characters, so only read up to one third
     *   of the buffer length; this will ensure that we can always fit
     *   what we read into the caller's buffer.  
     */
    inlen = bufl / 3;

    /* in any case, we can't read more than our own buffer size */
    if (inlen > sizeof(inbuf_))
        inlen = sizeof(inbuf_);

    /* read from the file */
    inlen = fp->readc(inbuf_, inlen);

    /* 
     *   Map data to the caller's buffer, and return the result.  We're
     *   certain that the data will fit in the caller's buffer: we're
     *   mapping only a third as many characters as we have bytes
     *   available, and each character can take up at most three bytes,
     *   hence the worst case is that we fill the buffer completely.
     *   
     *   On the other hand, we may only fill the buffer to a third of its
     *   capacity, but this is okay too, since we're not required to give
     *   the caller everything they asked for.  
     */
    return map(&buf, &bufl, inbuf_, inlen);
}